

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::swap
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  undefined1 local_48 [8];
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> copy;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *other_local;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_local;
  
  copy.elements_.alloc_.arena_ = (Arena *)other;
  pAVar1 = arena(this);
  pAVar2 = arena(copy.elements_.alloc_.arena_);
  if (pAVar1 == pAVar2) {
    InternalSwap(this,(Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
                      copy.elements_.alloc_.arena_);
  }
  else {
    Map((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)local_48,this);
    operator=(this,(Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
                   copy.elements_.alloc_.arena_);
    operator=((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
              copy.elements_.alloc_.arena_,
              (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)local_48);
    ~Map((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)local_48);
  }
  return;
}

Assistant:

void swap(Map& other) {
    if (arena() == other.arena()) {
      InternalSwap(other);
    } else {
      // TODO(zuguang): optimize this. The temporary copy can be allocated
      // in the same arena as the other message, and the "other = copy" can
      // be replaced with the fast-path swap above.
      Map copy = *this;
      *this = other;
      other = copy;
    }
  }